

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O3

void flatcc_json_printer_struct_vector_field
               (flatcc_json_printer_t *ctx,flatcc_json_printer_table_descriptor_t *td,int id,
               char *name,size_t len,size_t size,flatcc_json_printer_struct_f *pf)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  size_t sVar7;
  uint *puVar8;
  void *pvVar9;
  
  uVar2 = id * 2 + 4;
  if ((uVar2 < (uint)td->vsize) &&
     (uVar5 = (ulong)*(ushort *)((long)td->vtable + (ulong)uVar2), uVar5 != 0)) {
    puVar8 = (uint *)(uVar5 + (long)td->table);
    iVar1 = td->count;
    td->count = iVar1 + 1;
    if (iVar1 != 0) {
      pcVar6 = ctx->p;
      ctx->p = pcVar6 + 1;
      *pcVar6 = ',';
    }
    uVar2 = *puVar8;
    iVar1 = *(int *)((long)puVar8 + (ulong)uVar2);
    print_name(ctx,name,len);
    ctx->level = ctx->level + 1;
    pcVar6 = ctx->p;
    ctx->p = pcVar6 + 1;
    *pcVar6 = '[';
    if (iVar1 != 0) {
      pvVar9 = (void *)((long)puVar8 + (ulong)uVar2 + 4);
      pcVar6 = ctx->p;
      if (ctx->indent == '\0') {
        if (ctx->pflush <= pcVar6) {
          (*ctx->flush)(ctx,0);
          pcVar6 = ctx->p;
        }
      }
      else {
        ctx->p = pcVar6 + 1;
        *pcVar6 = '\n';
        uVar5 = (ulong)ctx->indent * (long)ctx->level;
        pcVar6 = ctx->pflush;
        pcVar4 = ctx->p;
        if (pcVar6 < pcVar4 + uVar5) {
          if (pcVar6 <= pcVar4) {
            (*ctx->flush)(ctx,0);
            pcVar6 = ctx->pflush;
            pcVar4 = ctx->p;
          }
          sVar7 = (long)pcVar6 - (long)pcVar4;
          if (sVar7 < uVar5) {
            do {
              memset(pcVar4,0x20,sVar7);
              ctx->p = ctx->p + sVar7;
              uVar5 = uVar5 - sVar7;
              (*ctx->flush)(ctx,0);
              pcVar4 = ctx->p;
              sVar7 = (long)ctx->pflush - (long)pcVar4;
            } while (sVar7 < uVar5);
          }
        }
        memset(pcVar4,0x20,uVar5);
        pcVar6 = ctx->p + uVar5;
      }
      ctx->level = ctx->level + 1;
      ctx->p = pcVar6 + 1;
      *pcVar6 = '{';
      (*pf)(ctx,pvVar9);
      pcVar6 = ctx->p;
      if (ctx->indent != '\0') {
        ctx->p = pcVar6 + 1;
        *pcVar6 = '\n';
        lVar3 = (long)ctx->level + -1;
        ctx->level = (int)lVar3;
        uVar5 = (ulong)ctx->indent * lVar3;
        pcVar6 = ctx->pflush;
        pcVar4 = ctx->p;
        if (pcVar6 < pcVar4 + uVar5) {
          if (pcVar6 <= pcVar4) {
            (*ctx->flush)(ctx,0);
            pcVar6 = ctx->pflush;
            pcVar4 = ctx->p;
          }
          sVar7 = (long)pcVar6 - (long)pcVar4;
          if (sVar7 < uVar5) {
            do {
              memset(pcVar4,0x20,sVar7);
              ctx->p = ctx->p + sVar7;
              uVar5 = uVar5 - sVar7;
              (*ctx->flush)(ctx,0);
              pcVar4 = ctx->p;
              sVar7 = (long)ctx->pflush - (long)pcVar4;
            } while (sVar7 < uVar5);
          }
        }
        memset(pcVar4,0x20,uVar5);
        pcVar6 = ctx->p + uVar5;
      }
      ctx->p = pcVar6 + 1;
      *pcVar6 = '}';
      while (iVar1 = iVar1 + -1, iVar1 != 0) {
        pcVar6 = ctx->p;
        ctx->p = pcVar6 + 1;
        *pcVar6 = ',';
        pcVar6 = ctx->p;
        if (ctx->indent == '\0') {
          if (ctx->pflush <= pcVar6) {
            (*ctx->flush)(ctx,0);
            pcVar6 = ctx->p;
          }
        }
        else {
          ctx->p = pcVar6 + 1;
          *pcVar6 = '\n';
          uVar5 = (ulong)ctx->indent * (long)ctx->level;
          pcVar6 = ctx->pflush;
          pcVar4 = ctx->p;
          if (pcVar6 < pcVar4 + uVar5) {
            if (pcVar6 <= pcVar4) {
              (*ctx->flush)(ctx,0);
              pcVar6 = ctx->pflush;
              pcVar4 = ctx->p;
            }
            sVar7 = (long)pcVar6 - (long)pcVar4;
            if (sVar7 < uVar5) {
              do {
                memset(pcVar4,0x20,sVar7);
                ctx->p = ctx->p + sVar7;
                uVar5 = uVar5 - sVar7;
                (*ctx->flush)(ctx,0);
                pcVar4 = ctx->p;
                sVar7 = (long)ctx->pflush - (long)pcVar4;
              } while (sVar7 < uVar5);
            }
          }
          memset(pcVar4,0x20,uVar5);
          pcVar6 = ctx->p + uVar5;
        }
        ctx->level = ctx->level + 1;
        pvVar9 = (void *)((long)pvVar9 + size);
        ctx->p = pcVar6 + 1;
        *pcVar6 = '{';
        (*pf)(ctx,pvVar9);
        pcVar6 = ctx->p;
        if (ctx->indent != '\0') {
          ctx->p = pcVar6 + 1;
          *pcVar6 = '\n';
          lVar3 = (long)ctx->level + -1;
          ctx->level = (int)lVar3;
          uVar5 = (ulong)ctx->indent * lVar3;
          pcVar6 = ctx->pflush;
          pcVar4 = ctx->p;
          if (pcVar6 < pcVar4 + uVar5) {
            if (pcVar6 <= pcVar4) {
              (*ctx->flush)(ctx,0);
              pcVar6 = ctx->pflush;
              pcVar4 = ctx->p;
            }
            sVar7 = (long)pcVar6 - (long)pcVar4;
            if (sVar7 < uVar5) {
              do {
                memset(pcVar4,0x20,sVar7);
                ctx->p = ctx->p + sVar7;
                uVar5 = uVar5 - sVar7;
                (*ctx->flush)(ctx,0);
                pcVar4 = ctx->p;
                sVar7 = (long)ctx->pflush - (long)pcVar4;
              } while (sVar7 < uVar5);
            }
          }
          memset(pcVar4,0x20,uVar5);
          pcVar6 = ctx->p + uVar5;
        }
        ctx->p = pcVar6 + 1;
        *pcVar6 = '}';
      }
    }
    pcVar6 = ctx->p;
    if (ctx->indent != '\0') {
      ctx->p = pcVar6 + 1;
      *pcVar6 = '\n';
      lVar3 = (long)ctx->level + -1;
      ctx->level = (int)lVar3;
      uVar5 = (ulong)ctx->indent * lVar3;
      pcVar6 = ctx->pflush;
      pcVar4 = ctx->p;
      if (pcVar6 < pcVar4 + uVar5) {
        if (pcVar6 <= pcVar4) {
          (*ctx->flush)(ctx,0);
          pcVar6 = ctx->pflush;
          pcVar4 = ctx->p;
        }
        sVar7 = (long)pcVar6 - (long)pcVar4;
        if (sVar7 < uVar5) {
          do {
            memset(pcVar4,0x20,sVar7);
            ctx->p = ctx->p + sVar7;
            uVar5 = uVar5 - sVar7;
            (*ctx->flush)(ctx,0);
            pcVar4 = ctx->p;
            sVar7 = (long)ctx->pflush - (long)pcVar4;
          } while (sVar7 < uVar5);
        }
      }
      memset(pcVar4,0x20,uVar5);
      pcVar6 = ctx->p + uVar5;
    }
    ctx->p = pcVar6 + 1;
    *pcVar6 = ']';
  }
  return;
}

Assistant:

void flatcc_json_printer_struct_vector_field(flatcc_json_printer_t *ctx,
        flatcc_json_printer_table_descriptor_t *td,
        int id, const char *name, size_t len,
        size_t size,
        flatcc_json_printer_struct_f pf)
{
    const uint8_t *p = get_field_ptr(td, id);
    uoffset_t count;

    if (p) {
        if (td->count++) {
            print_char(',');
        }
        p = read_uoffset_ptr(p);
        count = __flatbuffers_uoffset_read_from_pe(p);
        p += uoffset_size;
        print_name(ctx, name, len);
        print_start('[');
        if (count) {
            print_nl();
            print_start('{');
            pf(ctx, p);
            print_end('}');
            --count;
        }
        while (count--) {
            p += size;
            print_char(',');
            print_nl();
            print_start('{');
            pf(ctx, p);
            print_end('}');
        }
        print_end(']');
    }
}